

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *matrixIndices,double *inMatrices,
          double *paddedValues,int count)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int j;
  int i;
  float *offsetBeagleMatrix;
  double *offsetInMatrix;
  int matrixIndex;
  double *inMatrix;
  int k;
  int local_50;
  int local_4c;
  float *local_48;
  double *local_40;
  int local_28;
  
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    local_40 = (double *)
               (in_RDX + (long)(local_28 * *(int *)(in_RDI + 0x24) * *(int *)(in_RDI + 0x24) *
                               *(int *)(in_RDI + 0x34)) * 8);
    local_48 = *(float **)
                (*(long *)(in_RDI + 0xd0) + (long)*(int *)(in_RSI + (long)local_28 * 4) * 8);
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x34); local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x24); local_50 = local_50 + 1) {
        beagleMemCpy<float,double_const>(local_48,local_40,*(uint *)(in_RDI + 0x24));
        local_48[*(int *)(in_RDI + 0x24)] = (float)*(double *)(in_RCX + (long)local_28 * 8);
        local_48 = local_48 + *(int *)(in_RDI + 0x28);
        local_40 = local_40 + *(int *)(in_RDI + 0x24);
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrices(const int* matrixIndices,
                                                             const double* inMatrices,
                                                             const double* paddedValues,
                                                             int count) {
    for (int k = 0; k < count; k++) {
        const double* inMatrix = inMatrices + k*kStateCount*kStateCount*kCategoryCount;
        int matrixIndex = matrixIndices[k];

if (T_PAD != 0) {
        const double* offsetInMatrix = inMatrix;
        REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
        for(int i = 0; i < kCategoryCount; i++) {
            for(int j = 0; j < kStateCount; j++) {
                beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
                offsetBeagleMatrix[kStateCount] = paddedValues[k];
                offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
                offsetInMatrix += kStateCount;
            }
        }
} else {
        beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                     kMatrixSize * kCategoryCount);
}
    }

    return BEAGLE_SUCCESS;
}